

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

BOOL js_is_live_code(JSParseState *s)

{
  int iVar1;
  long in_RDI;
  BOOL local_4;
  
  iVar1 = get_prev_opcode(*(JSFunctionDef **)(in_RDI + 0x68));
  if ((((iVar1 == 0x23) || (iVar1 == 0x25)) || (iVar1 - 0x28U < 2)) ||
     (((iVar1 - 0x2eU < 3 || (iVar1 == 0x6b)) ||
      ((iVar1 == 0x6e || (iVar1 == 0xea || iVar1 == 0xeb)))))) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static BOOL js_is_live_code(JSParseState *s) {
    switch (get_prev_opcode(s->cur_func)) {
    case OP_tail_call:
    case OP_tail_call_method:
    case OP_return:
    case OP_return_undef:
    case OP_return_async:
    case OP_throw:
    case OP_throw_error:
    case OP_goto:
#if SHORT_OPCODES
    case OP_goto8:
    case OP_goto16:
#endif
    case OP_ret:
        return FALSE;
    default:
        return TRUE;
    }
}